

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void setarg(ident *id,tagval *v)

{
  tagval *v_local;
  ident *id_local;
  
  if ((aliasstack->usedargs & 1 << ((byte)id->index & 0x1f)) == 0) {
    pusharg(id,v,aliasstack->argstack + id->index);
    aliasstack->usedargs = 1 << ((byte)id->index & 0x1f) | aliasstack->usedargs;
  }
  else {
    if (((id->field_2).minval == 3) && ((id->field_4).args != (char *)0x0)) {
      operator_delete__((id->field_4).args);
    }
    ident::setval(id,v);
    cleancode(id);
  }
  return;
}

Assistant:

static inline void setarg(ident &id, tagval &v)
{
    if(aliasstack->usedargs&(1<<id.index))
    {
        if(id.valtype == VAL_STR) delete[] id.val.s;
        id.setval(v);
        cleancode(id);
    }
    else
    {
        pusharg(id, v, aliasstack->argstack[id.index]);
        aliasstack->usedargs |= 1<<id.index;
    }
}